

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  anon_class_24_3_6b44205e P;
  anon_class_24_3_03b17d9d P_00;
  Float FVar4;
  Float FVar5;
  Tuple2<pbrt::Point2,_float> TVar6;
  float fVar7;
  Float bInt;
  Point2f p;
  Float condIntegral;
  Bounds2f bCond;
  Float local_8c;
  Tuple2<pbrt::Point2,_float> local_88;
  Point2<float> local_80;
  WindowedPiecewiseConstant2D *local_78;
  Bounds2f *pBStack_70;
  Point2<float> *local_68;
  WindowedPiecewiseConstant2D *local_60;
  Bounds2f *pBStack_58;
  Float *local_50;
  Bounds2<float> local_48;
  Point2<float> local_38;
  
  FVar4 = SummedAreaTable::Integral(&this->sat,b);
  if ((FVar4 != 0.0) || (NAN(FVar4))) {
    local_8c = SummedAreaTable::Integral(&this->sat,b);
    local_50 = &local_8c;
    local_88.x = 0.0;
    local_88.y = 0.0;
    P.b = b;
    P.this = this;
    P.bInt = local_50;
    local_60 = this;
    pBStack_58 = b;
    FVar4 = SampleBisection<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                      (P,(u->super_Tuple2<pbrt::Point2,_float>).x,
                       (b->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                       (b->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                       (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                       (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    local_88.x = FVar4;
    local_80.super_Tuple2<pbrt::Point2,_float>.y = (b->pMin).super_Tuple2<pbrt::Point2,_float>.y;
    fVar7 = (float)((this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                   (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    fVar1 = FVar4 * fVar7;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
    auVar3 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),10);
    local_80.super_Tuple2<pbrt::Point2,_float>.x = auVar2._0_4_ / fVar7;
    local_38.super_Tuple2<pbrt::Point2,_float>.x = auVar3._0_4_ / fVar7;
    local_38.super_Tuple2<pbrt::Point2,_float>.y = (b->pMax).super_Tuple2<pbrt::Point2,_float>.y;
    Bounds2<float>::Bounds2(&local_48,&local_80,&local_38);
    if ((local_48.pMin.super_Tuple2<pbrt::Point2,_float>.x ==
         local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x) &&
       (!NAN(local_48.pMin.super_Tuple2<pbrt::Point2,_float>.x) &&
        !NAN(local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x))) {
      local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x =
           1.0 / fVar7 + local_48.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    }
    FVar4 = SummedAreaTable::Integral(&this->sat,&local_48);
    FVar5 = 0.0;
    TVar6.x = 0.0;
    TVar6.y = 0.0;
    if ((FVar4 != 0.0) || (NAN(FVar4))) {
      local_80.super_Tuple2<pbrt::Point2,_float>.x = SummedAreaTable::Integral(&this->sat,&local_48)
      ;
      P_00.bCond = &local_48;
      P_00.this = this;
      P_00.condIntegral = (Float *)&local_80;
      local_78 = this;
      pBStack_70 = &local_48;
      local_68 = &local_80;
      FVar4 = SampleBisection<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                        (P_00,(u->super_Tuple2<pbrt::Point2,_float>).y,
                         (b->pMin).super_Tuple2<pbrt::Point2,_float>.y,
                         (b->pMax).super_Tuple2<pbrt::Point2,_float>.y,
                         (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                         (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      local_88.y = FVar4;
      FVar5 = Eval(this,(Point2f *)&local_88);
      FVar5 = FVar5 / local_8c;
      TVar6 = local_88;
    }
    *pdf = FVar5;
  }
  else {
    *pdf = 0.0;
    TVar6.x = 0.0;
    TVar6.y = 0.0;
  }
  return (Point2f)TVar6;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Integral(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Define lambda function _Px_ for marginal cumulative distribution
        Float bInt = sat.Integral(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Integral(bx) / bInt;
        };

        // Sample marginal windowed function in $x$
        Point2f p;
        p.x = SampleBisection(Px, u[0], b.pMin.x, b.pMax.x, func.xSize());

        // Sample conditional windowed function in $y$
        // Compute 2D bounds _bCond_ for conditional sampling
        int nx = func.xSize();
        Bounds2f bCond(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                       Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (bCond.pMin.x == bCond.pMax.x)
            bCond.pMax.x += 1.f / nx;
        if (sat.Integral(bCond) == 0) {
            *pdf = 0;
            return {};
        }

        // Define lambda function for conditional distribution and sample $y$
        Float condIntegral = sat.Integral(bCond);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f by = bCond;
            by.pMax.y = y;
            return sat.Integral(by) / condIntegral;
        };
        p.y = SampleBisection(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = Eval(p) / bInt;
        return p;
    }